

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O1

void __thiscall
duckdb::BindContext::AddEntryBinding
          (BindContext *this,idx_t index,string *alias,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *types,StandardEntry *entry)

{
  EntryBinding *pEVar1;
  _Head_base<0UL,_duckdb::Binding_*,_false> local_70;
  EntryBinding *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_60;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  local_68 = (EntryBinding *)operator_new(0xe8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,
             &types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_60,
           &names->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  pEVar1 = local_68;
  EntryBinding::EntryBinding
            (local_68,alias,(vector<duckdb::LogicalType,_true> *)&local_48,&local_60,index,entry);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_60);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  local_70._M_head_impl = &pEVar1->super_Binding;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
              *)&this->bindings_list,
             (unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *)&local_70);
  if ((EntryBinding *)local_70._M_head_impl != (EntryBinding *)0x0) {
    (*((Binding *)&(local_70._M_head_impl)->_vptr_Binding)->_vptr_Binding[1])();
  }
  return;
}

Assistant:

void BindContext::AddEntryBinding(idx_t index, const string &alias, const vector<string> &names,
                                  const vector<LogicalType> &types, StandardEntry &entry) {
	AddBinding(make_uniq<EntryBinding>(alias, types, names, index, entry));
}